

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O1

pair<long,_bool> __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          unsigned_long_long *key)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  ulong in_RAX;
  undefined4 extraout_var;
  int in_ECX;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  pair<long,_bool> pVar11;
  pair<long,_bool> pVar12;
  locType pos;
  long local_28;
  long lVar4;
  
  if (this->depth == 0) {
    pVar11._8_8_ = 0;
    pVar11.first = in_RAX;
    return pVar11;
  }
  lVar4 = this->root;
  if (0 < this->depth) {
    iVar9 = 0;
    local_28 = lVar4;
    do {
      iVar3 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(this->file,&local_28);
      lVar4 = CONCAT44(extraout_var,iVar3);
      uVar2 = *(uint *)(lVar4 + 0x640);
      uVar6 = (ulong)uVar2;
      bVar10 = 0 < (int)uVar2;
      if ((int)uVar2 < 1) {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        if (*(ulong *)(lVar4 + 0x328) < *key) {
          uVar8 = 0;
          do {
            if (uVar6 - 1 == uVar8) {
              bVar10 = uVar8 + 1 < uVar6;
              uVar5 = uVar6;
              goto LAB_0010b560;
            }
            uVar5 = uVar8 + 1;
            lVar1 = uVar8 * 8;
            uVar8 = uVar5;
          } while (*(ulong *)(lVar4 + 0x330 + lVar1) < *key);
          bVar10 = uVar5 < uVar6;
        }
      }
LAB_0010b560:
      in_ECX = (int)uVar5;
      if (iVar9 < this->depth + -1) {
        uVar5 = uVar5 & 0xffffffff;
        if ((bVar10) && (*(ulong *)(lVar4 + 0x328 + uVar5 * 8) <= *key)) {
          local_28 = *(long *)(lVar4 + 8 + uVar5 * 8);
        }
        else {
          local_28 = *(long *)(lVar4 + uVar5 * 8);
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < this->depth);
  }
  if (in_ECX != *(int *)(lVar4 + 0x640)) {
    if (*(ulong *)(lVar4 + 0x328 + (long)in_ECX * 8) <= *key) {
      lVar4 = *(long *)(lVar4 + (long)in_ECX * 8);
      uVar7 = CONCAT71((int7)(*key >> 8),1);
      goto LAB_0010b5c0;
    }
  }
  uVar7 = 0;
LAB_0010b5c0:
  pVar12._8_8_ = uVar7;
  pVar12.first = lVar4;
  return pVar12;
}

Assistant:

std::pair<T, bool> find(const Key &key) {
            T ret;
            if (!depth)return std::make_pair(ret, 0);
            locType pos = root;
            node *x;
            int i, j;
            for (i = 0; i < depth; ++i) {
                x = file->read(pos);
                for (j = 0; j < x->sz && Compare()(x->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < x->sz && !Compare()(key, x->keyvalue[j]))pos = x->pointer[j + 1];
                    else pos = x->pointer[j];
                }
            }
            if (j == x->sz || Compare()(key, x->keyvalue[j]))
                return std::make_pair(ret, false);
            ret = x->val[j];
            return std::make_pair(ret, true);
        }